

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluStrUtil.cpp
# Opt level: O0

ostream * eglu::operator<<(ostream *str,SurfaceAttribListFmt *fmt)

{
  SurfaceAttribListFmt *stream;
  ostream *poVar1;
  Hex<8UL> hex;
  SurfaceAttribValueFmt local_30;
  char *local_28;
  char *attribName;
  int attrib;
  int pos;
  SurfaceAttribListFmt *fmt_local;
  ostream *str_local;
  
  attribName._4_4_ = 0;
  _attrib = fmt;
  fmt_local = (SurfaceAttribListFmt *)str;
  std::operator<<(str,"{ ");
  while( true ) {
    attribName._0_4_ = *(deUint32 *)(*(long *)_attrib + (long)attribName._4_4_ * 4);
    if (attribName._4_4_ != 0) {
      std::operator<<((ostream *)fmt_local,", ");
    }
    if ((deUint32)attribName == 0x3038) break;
    local_28 = getSurfaceAttribName((deUint32)attribName);
    stream = fmt_local;
    if (local_28 == (char *)0x0) {
      hex = tcu::toHex<int>((deUint32)attribName);
      poVar1 = tcu::Format::operator<<((ostream *)stream,hex);
      std::operator<<(poVar1,", ???");
LAB_0078caed:
      std::operator<<((ostream *)fmt_local," }");
      return (ostream *)fmt_local;
    }
    poVar1 = std::operator<<((ostream *)fmt_local,local_28);
    poVar1 = std::operator<<(poVar1,", ");
    local_30 = getSurfaceAttribValueStr
                         ((deUint32)attribName,
                          *(int *)(*(long *)_attrib + (long)(attribName._4_4_ + 1) * 4));
    operator<<(poVar1,&local_30);
    attribName._4_4_ = attribName._4_4_ + 2;
  }
  std::operator<<((ostream *)fmt_local,"EGL_NONE");
  goto LAB_0078caed;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const SurfaceAttribListFmt& fmt)
{
	int pos = 0;

	str << "{ ";

	for (;;)
	{
		int attrib = fmt.attribs[pos];

		if (pos != 0)
			str << ", ";

		if (attrib == EGL_NONE)
		{
			// Terminate.
			str << "EGL_NONE";
			break;
		}

		const char*	attribName = getSurfaceAttribName(attrib);

		if (attribName)
		{
			// Valid attribute, print value.
			str << attribName << ", " << getSurfaceAttribValueStr(attrib, fmt.attribs[pos+1]);
			pos += 2;
		}
		else
		{
			// Invalid attribute. Terminate parsing.
			str << tcu::toHex(attrib) << ", ???";
			break;
		}
	}

	str << " }";
	return str;
}